

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O2

void __thiscall
anurbs::NurbsSurfaceGeometry<2L>::NurbsSurfaceGeometry
          (NurbsSurfaceGeometry<2L> *this,Index degree_u,Index degree_v,VectorXd *knots_u,
          VectorXd *knots_v,Poles *poles,VectorXd *weights)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  runtime_error *this_00;
  
  (this->super_SurfaceBase<2L>)._vptr_SurfaceBase =
       (_func_int **)&PTR__NurbsSurfaceGeometry_0038c728;
  this->m_degree_u = degree_u;
  this->m_degree_v = degree_v;
  this->m_nb_poles_u =
       ((knots_u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows -
       degree_u) + 1;
  this->m_nb_poles_v =
       ((knots_v->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows -
       degree_v) + 1;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&this->m_knots_u,
             (DenseStorage<double,__1,__1,_1,_0> *)knots_u);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&this->m_knots_v,
             (DenseStorage<double,__1,__1,_1,_0> *)knots_v);
  Eigen::DenseStorage<double,_-1,_-1,_2,_1>::DenseStorage
            ((DenseStorage<double,__1,__1,_2,_1> *)&this->m_poles,
             (DenseStorage<double,__1,__1,_2,_1> *)poles);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&this->m_weights,
             (DenseStorage<double,__1,__1,_1,_0> *)weights);
  lVar1 = (this->m_knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
          .m_rows;
  iVar4 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])(this);
  lVar2 = (this->m_knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
          .m_rows;
  iVar5 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])(this);
  lVar3 = (this->m_poles).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_1,__1,_2>_>.m_storage.
          m_rows;
  if (((lVar2 - CONCAT44(extraout_var_00,iVar5)) + 1) * ((lVar1 - CONCAT44(extraout_var,iVar4)) + 1)
      - lVar3 == 0) {
    if (lVar3 == (weights->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_rows) {
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Number of poles and weights do not match");
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Number of knots and poles do not match");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

NurbsSurfaceGeometry(
        const Index degree_u,
        const Index degree_v,
        const Eigen::VectorXd& knots_u,
        const Eigen::VectorXd& knots_v,
        const Poles& poles,
        const Eigen::VectorXd& weights)
        : m_degree_u(degree_u)
        , m_degree_v(degree_v)
        , m_nb_poles_u(Nurbs::nb_poles(degree_u, length(knots_u)))
        , m_nb_poles_v(Nurbs::nb_poles(degree_v, length(knots_v)))
        , m_knots_u(knots_u)
        , m_knots_v(knots_v)
        , m_poles(poles)
        , m_weights(weights)
    {
        static_assert(TDimension > 0);

        if (nb_poles_u() * nb_poles_v() != nb_poles()) {
            throw std::runtime_error("Number of knots and poles do not match");
        }

        if (nb_poles() != length(weights)) {
            throw std::runtime_error("Number of poles and weights do not match");
        }
    }